

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.c
# Opt level: O2

void replay(void)

{
  uint uVar1;
  nh_bool nVar2;
  int iVar3;
  nh_log_status status;
  undefined4 uVar4;
  wchar_t wVar5;
  fnchar **__ptr;
  nh_menuitem_conflict *items;
  char *pcVar6;
  long lVar7;
  long lVar8;
  nh_menuitem *_item_;
  ulong uVar9;
  char *dir;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  wchar_t filecount;
  wchar_t pick [1];
  fnchar savedir [256];
  fnchar logdir [256];
  char buf [256];
  fnchar filename [1024];
  nh_game_info gi;
  
  nVar2 = get_gamedir(LOG_DIR,logdir);
  if (nVar2 == '\0') {
    logdir[0] = '\0';
  }
  nVar2 = get_gamedir(SAVE_DIR,savedir);
  if (nVar2 == '\0') {
    savedir[0] = '\0';
  }
  dir = logdir;
  if (logdir[0] == '\0') {
    if (savedir[0] == '\0') {
      curses_msgwin("There are no games to replay.");
      return;
    }
    dir = savedir;
  }
  do {
    while( true ) {
      pcVar6 = logdir;
      filename[0] = '\0';
      __ptr = list_gamefiles(dir,&filecount);
      wVar5 = filecount;
      uVar9 = (ulong)filecount;
      if (uVar9 != 0) break;
      if (dir == savedir) {
        curses_msgwin("There are no saved games to replay.");
        savedir[0] = '\0';
      }
      else {
        curses_msgwin("There are no completed games to replay.");
        logdir[0] = '\0';
        pcVar6 = savedir;
      }
      dir = pcVar6;
      if (*pcVar6 == '\0') {
        return;
      }
    }
    uVar11 = uVar9 + 2;
    items = (nh_menuitem_conflict *)malloc(uVar11 * 0x10c);
    if ((dir == pcVar6) && (savedir[0] != '\0')) {
      if (wVar5 < L'\xffffffff') {
        uVar1 = (int)uVar11 * 2;
        uVar11 = (ulong)uVar1;
        items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar1 * 0x10c);
      }
      items->id = L'\xffffffff';
      items->role = MI_NORMAL;
      items->accel = '!';
      items->group_accel = '\0';
      items->selected = '\0';
      builtin_strncpy(items->caption,"View saved games instead",0x19);
      iVar3 = (int)uVar11;
joined_r0x0011498e:
      if (iVar3 < 2) {
        uVar11 = (ulong)(uint)(iVar3 * 2);
        items = (nh_menuitem_conflict *)realloc(items,(long)(iVar3 * 2) * 0x10c);
      }
      items[1].id = L'\0';
      items[1].role = MI_NORMAL;
      items[1].accel = '\0';
      items[1].group_accel = '\0';
      items[1].selected = '\0';
      items[1].caption[0] = '\0';
      lVar8 = 2;
    }
    else {
      if ((dir == savedir) && (logdir[0] != '\0')) {
        if (wVar5 < L'\xffffffff') {
          uVar1 = (int)uVar11 * 2;
          uVar11 = (ulong)uVar1;
          items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar1 * 0x10c);
        }
        items->id = L'\xffffffff';
        items->role = MI_NORMAL;
        items->accel = '!';
        items->group_accel = '\0';
        items->selected = '\0';
        builtin_strncpy(items->caption,"View completed games instead",0x1d);
        iVar3 = (int)uVar11;
        goto joined_r0x0011498e;
      }
      lVar8 = 0;
    }
    lVar7 = lVar8 * 0x10c + 0x10a;
    lVar10 = 0;
    while (lVar10 < (int)uVar9) {
      iVar3 = open(__ptr[lVar10],2,0x1b0);
      status = nh_get_savegame_status(iVar3,&gi);
      close(iVar3);
      describe_game(buf,status,(nh_game_info_conflict *)&gi);
      if ((long)(int)uVar11 <= lVar8 + lVar10) {
        uVar1 = (int)uVar11 * 2;
        uVar11 = (ulong)uVar1;
        items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar1 * 0x10c);
      }
      lVar10 = lVar10 + 1;
      uVar4 = (undefined4)lVar10;
      if (status == LS_IN_PROGRESS) {
        uVar4 = 0;
      }
      pcVar6 = items->caption + lVar7 + -8;
      *(undefined4 *)(pcVar6 + -0x10a) = uVar4;
      *(undefined4 *)(pcVar6 + -0x106) = 1;
      *(undefined2 *)(pcVar6 + -2) = MI_TEXT >> 0x10;
      *pcVar6 = '\0';
      strcpy(pcVar6 + -0x102,buf);
      lVar7 = lVar7 + 0x10c;
      uVar9 = (ulong)(uint)filecount;
    }
    pcVar6 = "Pick a completed game to view";
    if (dir == savedir) {
      pcVar6 = "Pick a saved game to view";
    }
    wVar5 = curses_display_menu(items,(int)lVar8 + (int)lVar10,pcVar6,L'\x01',pick);
    free(items);
    filename[0] = '\0';
    if (pick[0] != L'\xffffffff' && L'\0' < wVar5) {
      strncat(filename,__ptr[(long)pick[0] + -1],0x3ff);
    }
    for (lVar8 = 0; lVar8 < filecount; lVar8 = lVar8 + 1) {
      free(__ptr[lVar8]);
    }
    free(__ptr);
    if (wVar5 < L'\x01') {
      return;
    }
    if (pick[0] != L'\xffffffff') {
      wVar5 = open(filename,2,0x1b0);
      replay_commandloop(wVar5);
      close(wVar5);
      return;
    }
    bVar12 = dir == savedir;
    dir = savedir;
    if (bVar12) {
      dir = logdir;
    }
  } while( true );
}

Assistant:

void replay(void)
{
    char buf[BUFSZ];
    fnchar logdir[BUFSZ], savedir[BUFSZ], filename[1024], *dir, **files;
    struct nh_menuitem *items;
    int i, n, fd, icount, size, filecount, pick[1];
    enum nh_log_status status;
    struct nh_game_info gi;
    
    if (!get_gamedir(LOG_DIR, logdir))	logdir[0] = '\0';
    if (!get_gamedir(SAVE_DIR, savedir))savedir[0] = '\0';
    
    if (*logdir)	dir = logdir;
    else if (*savedir)	dir = savedir;
    else {
	curses_msgwin("There are no games to replay.");
	return;
    }
    
    while (1) {
	filename[0] = '\0';
	files = list_gamefiles(dir, &filecount);
	/* make sure there are some files to show */
	if (!filecount) {
	    if (dir == savedir) {
		curses_msgwin("There are no saved games to replay.");
		savedir[0] = '\0';
	    } else {
		curses_msgwin("There are no completed games to replay.");
		logdir[0] = '\0';
	    }
	    
	    dir = (dir == savedir) ? logdir : savedir;
	    if (!*dir) return;
	    continue;
	}
	
	icount = 0;
	size = filecount + 2;
	items = malloc(size * sizeof(struct nh_menuitem));

	if (dir == logdir && *savedir) {
	    add_menu_item(items, size, icount, -1,
			  "View saved games instead", '!', FALSE);
	    add_menu_txt(items, size, icount, "", MI_NORMAL);
	} else if (dir == savedir && *logdir) {
	    add_menu_item(items, size, icount, -1,
			  "View completed games instead", '!', FALSE);
	    add_menu_txt(items, size, icount, "", MI_NORMAL);
	}

	/* add all the files to the menu */
	for (i = 0; i < filecount; i++) {
	    fd = sys_open(files[i], O_RDWR, 0660);
	    status = nh_get_savegame_status(fd, &gi);
	    close(fd);
	    
	    describe_game(buf, status, &gi);
	    add_menu_item(items, size, icount,
			    (status == LS_IN_PROGRESS) ? 0 : i + 1,
			    buf, 0, FALSE);
	}

	n = curses_display_menu(items, icount,
				(dir == savedir ?
				 "Pick a saved game to view" :
				 "Pick a completed game to view"),
				PICK_ONE, pick);
	free(items);
	filename[0] = '\0';
	if (n > 0 && pick[0] != -1)
	    fnncat(filename, files[pick[0]-1], sizeof(filename)/sizeof(fnchar)-1);
	
	for (i = 0; i < filecount; i++)
	    free(files[i]);
	free(files);
	
	if (n <= 0)
	    return;
	
	if (pick[0] == -1) {
	    dir = (dir == savedir) ? logdir : savedir;
	    continue;
	}
	
	/* we have a valid filename */
	break;
    }
    
    fd = sys_open(filename, O_RDWR, 0660);
    replay_commandloop(fd);
    close(fd);
}